

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget_p.cpp
# Opt level: O0

void __thiscall QGraphicsWidgetPrivate::setHeight(QGraphicsWidgetPrivate *this,qreal h)

{
  ulong uVar1;
  QGraphicsWidget *pQVar2;
  QGraphicsWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  qreal qVar3;
  qreal atop;
  qreal awidth;
  QGraphicsWidget *q;
  QGraphicsItem *in_stack_ffffffffffffff78;
  QGraphicsLayoutItem *in_stack_ffffffffffffff90;
  QRectF local_48;
  QRectF local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = qIsNaN(in_XMM0_Qa);
  if ((uVar1 & 1) == 0) {
    pQVar2 = q_func(in_RDI);
    QGraphicsLayoutItem::geometry(in_stack_ffffffffffffff90);
    qVar3 = QRectF::height(&local_28);
    if ((qVar3 != in_XMM0_Qa) || (NAN(qVar3) || NAN(in_XMM0_Qa))) {
      qVar3 = QGraphicsItem::x(in_stack_ffffffffffffff78);
      atop = QGraphicsItem::y(in_stack_ffffffffffffff78);
      (*(in_RDI->super_QGraphicsItemPrivate)._vptr_QGraphicsItemPrivate[0xb])();
      QRectF::QRectF(&local_48,qVar3,atop,awidth,in_XMM0_Qa);
      (**(code **)(*(long *)&pQVar2->super_QGraphicsObject + 0x60))(pQVar2,&local_48);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsWidgetPrivate::setHeight(qreal h)
{
    if (qIsNaN(h))
        return;
    Q_Q(QGraphicsWidget);
    if (q->geometry().height() == h)
        return;

    q->setGeometry(QRectF(q->x(), q->y(), width(), h));
}